

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.hpp
# Opt level: O0

bool __thiscall csv::CSVField::operator==(CSVField *this,char *other)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_38;
  size_t local_28;
  char *local_20;
  char *local_18;
  char *other_local;
  CSVField *this_local;
  
  local_28 = (this->sv)._M_len;
  local_20 = (this->sv)._M_str;
  local_18 = other;
  other_local = (char *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,other);
  __x._M_str = local_20;
  __x._M_len = local_28;
  bVar1 = std::operator==(__x,local_38);
  return bVar1;
}

Assistant:

CONSTEXPR bool CSVField::operator==(const char * other) const noexcept
    {
        return this->sv == other;
    }